

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandStrash(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  long lVar5;
  char *pcVar6;
  Vec_Ptr_t *pVVar7;
  char *pcVar8;
  uint fCleanup;
  uint fAllNodes;
  uint local_44;
  
  pAVar4 = Abc_FrameReadNtk(pAbc);
  fAllNodes = 0;
  Extra_UtilGetoptReset();
  fCleanup = 1;
  local_44 = 0;
  bVar2 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        while (iVar3 = Extra_UtilGetopt(argc,argv,"acrih"), iVar3 == 0x69) {
          bVar2 = (bool)(bVar2 ^ 1);
        }
        if (0x62 < iVar3) break;
        if (iVar3 == -1) {
          if (pAVar4 == (Abc_Ntk_t *)0x0) {
            pcVar6 = "Empty network.\n";
          }
          else {
            pAVar4 = Abc_NtkStrash(pAVar4,fAllNodes,fCleanup,local_44);
            if (pAVar4 != (Abc_Ntk_t *)0x0) {
              if ((bVar2) && (pVVar7 = pAVar4->vPos, 0 < pVVar7->nSize)) {
                lVar5 = 0;
                do {
                  puVar1 = (uint *)((long)pVVar7->pArray[lVar5] + 0x14);
                  *puVar1 = *puVar1 ^ 0x400;
                  lVar5 = lVar5 + 1;
                  pVVar7 = pAVar4->vPos;
                } while (lVar5 < pVVar7->nSize);
              }
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar4);
              return 0;
            }
            pcVar6 = "Strashing has failed.\n";
          }
          iVar3 = -1;
          goto LAB_002042fc;
        }
        if (iVar3 != 0x61) goto LAB_002041c4;
        fAllNodes = fAllNodes ^ 1;
      }
      if (iVar3 != 99) break;
      fCleanup = fCleanup ^ 1;
    }
    if (iVar3 != 0x72) break;
    local_44 = local_44 ^ 1;
  }
LAB_002041c4:
  Abc_Print(-2,"usage: strash [-acrih]\n");
  Abc_Print(-2,"\t        transforms combinational logic into an AIG\n");
  pcVar8 = "all";
  pcVar6 = "all";
  if (fAllNodes == 0) {
    pcVar6 = "DFS";
  }
  Abc_Print(-2,"\t-a    : toggles between using all nodes and DFS nodes [default = %s]\n",pcVar6);
  if (fCleanup == 0) {
    pcVar8 = "DFS";
  }
  Abc_Print(-2,"\t-c    : toggles cleanup to remove the dagling AIG nodes [default = %s]\n",pcVar8);
  pcVar8 = "yes";
  pcVar6 = "yes";
  if (local_44 == 0) {
    pcVar6 = "no";
  }
  Abc_Print(-2,"\t-r    : toggles using the record of AIG subgraphs [default = %s]\n",pcVar6);
  if (!bVar2) {
    pcVar8 = "no";
  }
  Abc_Print(-2,"\t-i    : toggles complementing the POs of the AIG [default = %s]\n",pcVar8);
  pcVar6 = "\t-h    : print the command usage\n";
  iVar3 = -2;
LAB_002042fc:
  Abc_Print(iVar3,pcVar6);
  return 1;
}

Assistant:

int Abc_CommandStrash( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    Abc_Obj_t * pObj;
    int c;
    int fAllNodes;
    int fRecord;
    int fCleanup;
    int fComplOuts;
    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fAllNodes = 0;
    fCleanup  = 1;
    fRecord   = 0;
    fComplOuts= 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "acrih" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fAllNodes ^= 1;
            break;
        case 'c':
            fCleanup ^= 1;
            break;
        case 'r':
            fRecord ^= 1;
            break;
        case 'i':
            fComplOuts ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    // get the new network
    pNtkRes = Abc_NtkStrash( pNtk, fAllNodes, fCleanup, fRecord );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Strashing has failed.\n" );
        return 1;
    }
    if ( fComplOuts )
    Abc_NtkForEachPo( pNtkRes, pObj, c )
        Abc_ObjXorFaninC( pObj, 0 );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: strash [-acrih]\n" );
    Abc_Print( -2, "\t        transforms combinational logic into an AIG\n" );
    Abc_Print( -2, "\t-a    : toggles between using all nodes and DFS nodes [default = %s]\n", fAllNodes? "all": "DFS" );
    Abc_Print( -2, "\t-c    : toggles cleanup to remove the dagling AIG nodes [default = %s]\n", fCleanup? "all": "DFS" );
    Abc_Print( -2, "\t-r    : toggles using the record of AIG subgraphs [default = %s]\n", fRecord? "yes": "no" );
    Abc_Print( -2, "\t-i    : toggles complementing the POs of the AIG [default = %s]\n", fComplOuts? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}